

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::check_id(Parser *this)

{
  bool bVar1;
  ID *pIVar2;
  Exception *this_00;
  string sStack_38;
  
  pIVar2 = ID_table_t::operator[]
                     ((this->ID_tables_vec->
                      super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>)._M_impl.
                      super__Vector_impl_data._M_start + this->c_add_val,this->c_val);
  bVar1 = ID::get_declared(pIVar2);
  if (bVar1) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  pIVar2 = ID_table_t::operator[]
                     ((this->ID_tables_vec->
                      super__Vector_base<ID_table_t,_std::allocator<ID_table_t>_>)._M_impl.
                      super__Vector_impl_data._M_start + this->c_add_val,this->c_val);
  ID::get_name_abi_cxx11_(&sStack_38,pIVar2);
  Exception::Exception(this_00,"Parser error: use of undeclared ID: ",&sStack_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Parser::check_id() {
    if ( !(ID_tables_vec[c_add_val][c_val].get_declared()) )
        throw Exception("Parser error: use of undeclared ID: ", ID_tables_vec[c_add_val][c_val].get_name());
}